

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  ulong uVar2;
  char local_1a;
  byte local_19;
  
  do {
    local_1a = (char)__fd;
    if (this->OutBufCur < this->OutBufEnd) goto LAB_00137459;
    uVar2 = write((int)this,&local_1a,(size_t)&local_19);
    __fd = (int)local_19;
  } while ((short)uVar2 == 1);
  if ((uVar2 & 0xffff) != 0) {
LAB_00137459:
    pcVar1 = this->OutBufCur;
    this->OutBufCur = pcVar1 + 1;
    *pcVar1 = local_1a;
  }
  return (ssize_t)this;
}

Assistant:

raw_ostream &raw_ostream::write(unsigned char C) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(OutBufCur >= OutBufEnd)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == Unbuffered) {
        write_impl(reinterpret_cast<char*>(&C), 1);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(C);
    }

    flush_nonempty();
  }

  *OutBufCur++ = C;
  return *this;
}